

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Decoration
anon_unknown.dwarf_889438::TranslateBlockDecoration(TStorageQualifier storage,bool useStorageBuffer)

{
  Decoration DStack_c;
  bool useStorageBuffer_local;
  TStorageQualifier storage_local;
  
  switch(storage) {
  case EvqVaryingIn:
    DStack_c = Block;
    break;
  case EvqVaryingOut:
    DStack_c = Block;
    break;
  case EvqUniform:
    DStack_c = Block;
    break;
  case EvqBuffer:
    DStack_c = BufferBlock;
    if (useStorageBuffer) {
      DStack_c = Block;
    }
    break;
  case EvqShared:
    DStack_c = Block;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x188,
                  "spv::Decoration (anonymous namespace)::TranslateBlockDecoration(const glslang::TStorageQualifier, bool)"
                 );
  case EvqPayload:
    DStack_c = Block;
    break;
  case EvqPayloadIn:
    DStack_c = Block;
    break;
  case EvqHitAttr:
    DStack_c = Block;
    break;
  case EvqCallableData:
    DStack_c = Block;
    break;
  case EvqCallableDataIn:
    DStack_c = Block;
    break;
  case EvqHitObjectAttrNV:
    DStack_c = Block;
  }
  return DStack_c;
}

Assistant:

spv::Decoration TranslateBlockDecoration(const glslang::TStorageQualifier storage, bool useStorageBuffer)
{
    switch (storage) {
    case glslang::EvqUniform:      return spv::DecorationBlock;
    case glslang::EvqBuffer:       return useStorageBuffer ? spv::DecorationBlock : spv::DecorationBufferBlock;
    case glslang::EvqVaryingIn:    return spv::DecorationBlock;
    case glslang::EvqVaryingOut:   return spv::DecorationBlock;
    case glslang::EvqShared:       return spv::DecorationBlock;
    case glslang::EvqPayload:      return spv::DecorationBlock;
    case glslang::EvqPayloadIn:    return spv::DecorationBlock;
    case glslang::EvqHitAttr:      return spv::DecorationBlock;
    case glslang::EvqCallableData:   return spv::DecorationBlock;
    case glslang::EvqCallableDataIn: return spv::DecorationBlock;
    case glslang::EvqHitObjectAttrNV: return spv::DecorationBlock;
    default:
        assert(0);
        break;
    }

    return spv::DecorationMax;
}